

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BerdyHelper.cpp
# Opt level: O2

bool __thiscall
iDynTree::BerdyHelper::serializeDynamicVariablesFixedBase
          (BerdyHelper *this,LinkProperAccArray *properAccs,
          LinkNetTotalWrenchesWithoutGravity *netTotalWrenchesWithoutGrav,
          LinkNetExternalWrenches *netExtWrenches,LinkInternalWrenches *linkJointWrenches,
          JointDOFsDoubleArray *jointTorques,JointDOFsDoubleArray *jointAccs,VectorDynSize *d)

{
  undefined8 uVar1;
  long lVar2;
  SpatialMotionVector *vec;
  SpatialForceVector *pSVar3;
  long *plVar4;
  ulong uVar5;
  undefined8 *puVar6;
  JointIndex jntIdx;
  LinkInternalWrenches *subVec;
  LinkIndex linkIdx;
  long lVar7;
  IndexRange IVar8;
  IndexRange range;
  IndexRange range_00;
  IndexRange range_01;
  IndexRange range_02;
  Matrix<double,_6,_1,_0,_6,_1> local_68;
  
  if ((this->m_options).berdyVariant == ORIGINAL_BERDY_FIXED_BASE) {
    lVar7 = 0;
    subVec = linkJointWrenches;
    while( true ) {
      lVar2 = iDynTree::Model::getNrOfLinks();
      if (lVar2 <= lVar7) break;
      iDynTree::Traversal::getBaseLink();
      lVar2 = iDynTree::Link::getIndex();
      if (lVar7 != lVar2) {
        IVar8 = getRangeLinkVariable(this,LINK_BODY_PROPER_ACCELERATION,lVar7);
        range.offset = IVar8.size;
        vec = (SpatialMotionVector *)iDynTree::LinkAccArray::operator()(properAccs,lVar7);
        toEigen(&local_68,vec);
        range.size = (ptrdiff_t)&local_68;
        setSubVector<Eigen::Matrix<double,6,1,0,6,1>>
                  ((iDynTree *)d,(VectorDynSize *)IVar8.offset,range,
                   (Matrix<double,_6,_1,_0,_6,_1> *)subVec);
        IVar8 = getRangeLinkVariable(this,NET_INT_AND_EXT_WRENCHES_ON_LINK_WITHOUT_GRAV,lVar7);
        range_00.offset = IVar8.size;
        pSVar3 = (SpatialForceVector *)
                 iDynTree::LinkWrenches::operator()(netTotalWrenchesWithoutGrav,lVar7);
        toEigen(&local_68,pSVar3);
        range_00.size = (ptrdiff_t)&local_68;
        setSubVector<Eigen::Matrix<double,6,1,0,6,1>>
                  ((iDynTree *)d,(VectorDynSize *)IVar8.offset,range_00,
                   (Matrix<double,_6,_1,_0,_6,_1> *)subVec);
        if ((this->m_options).includeAllNetExternalWrenchesAsDynamicVariables == true) {
          IVar8 = getRangeLinkVariable(this,NET_EXT_WRENCH,lVar7);
          range_01.offset = IVar8.size;
          pSVar3 = (SpatialForceVector *)iDynTree::LinkWrenches::operator()(netExtWrenches,lVar7);
          toEigen(&local_68,pSVar3);
          range_01.size = (ptrdiff_t)&local_68;
          setSubVector<Eigen::Matrix<double,6,1,0,6,1>>
                    ((iDynTree *)d,(VectorDynSize *)IVar8.offset,range_01,
                     (Matrix<double,_6,_1,_0,_6,_1> *)subVec);
        }
      }
      lVar7 = lVar7 + 1;
    }
    lVar7 = 0;
    while( true ) {
      lVar2 = iDynTree::Model::getNrOfJoints();
      if (lVar2 <= lVar7) break;
      plVar4 = (long *)iDynTree::Model::getJoint((long)this);
      lVar2 = iDynTree::Traversal::getChildLinkIndexFromJointIndex
                        ((Model *)&this->m_dynamicsTraversal,(long)this);
      IVar8 = getRangeJointVariable(this,JOINT_WRENCH,lVar7);
      range_02.offset = IVar8.size;
      pSVar3 = (SpatialForceVector *)iDynTree::LinkWrenches::operator()(linkJointWrenches,lVar2);
      toEigen(&local_68,pSVar3);
      range_02.size = (ptrdiff_t)&local_68;
      setSubVector<Eigen::Matrix<double,6,1,0,6,1>>
                ((iDynTree *)d,(VectorDynSize *)IVar8.offset,range_02,
                 (Matrix<double,_6,_1,_0,_6,_1> *)subVec);
      IVar8 = getRangeDOFVariable(this,DOF_ACCELERATION,lVar7);
      uVar5 = (**(code **)(*plVar4 + 0xc0))(plVar4);
      puVar6 = (undefined8 *)iDynTree::VectorDynSize::operator()((VectorDynSize *)jointAccs,uVar5);
      uVar1 = *puVar6;
      puVar6 = (undefined8 *)iDynTree::VectorDynSize::operator()(d,IVar8.offset);
      *puVar6 = uVar1;
      IVar8 = getRangeDOFVariable(this,DOF_TORQUE,lVar7);
      uVar5 = (**(code **)(*plVar4 + 0xc0))(plVar4);
      puVar6 = (undefined8 *)
               iDynTree::VectorDynSize::operator()((VectorDynSize *)jointTorques,uVar5);
      uVar1 = *puVar6;
      puVar6 = (undefined8 *)iDynTree::VectorDynSize::operator()(d,IVar8.offset);
      *puVar6 = uVar1;
      lVar7 = lVar7 + 1;
    }
  }
  return true;
}

Assistant:

bool BerdyHelper::serializeDynamicVariablesFixedBase(LinkProperAccArray& properAccs,
                                                                  LinkNetTotalWrenchesWithoutGravity& netTotalWrenchesWithoutGrav,
                                                                  LinkNetExternalWrenches& netExtWrenches,
                                                                  LinkInternalWrenches& linkJointWrenches,
                                                                  JointDOFsDoubleArray& jointTorques,
                                                                  JointDOFsDoubleArray& jointAccs,
                                                                  VectorDynSize& d)
{
    assert(d.size() == this->getNrOfDynamicVariables());
    assert(this->m_options.berdyVariant == ORIGINAL_BERDY_FIXED_BASE);

    if( this->m_options.berdyVariant == ORIGINAL_BERDY_FIXED_BASE )
    {
        // In the original formulation, also the totalNetWrenchesWithoutGravity where part of the variables
        // And the base link is not considered amoing the dynamic variables
        for(LinkIndex linkIdx = 0; linkIdx < static_cast<LinkIndex>(m_model.getNrOfLinks()); linkIdx++)
        {
            // The base variables are not estimated for ORIGINAL_BERDY_FIXED_BASE
            if( linkIdx != this->m_dynamicsTraversal.getBaseLink()->getIndex() )
            {
                setSubVector(d,getRangeLinkVariable(LINK_BODY_PROPER_ACCELERATION,linkIdx),toEigen(properAccs(linkIdx)));
                setSubVector(d,getRangeLinkVariable(NET_INT_AND_EXT_WRENCHES_ON_LINK_WITHOUT_GRAV,linkIdx),toEigen(netTotalWrenchesWithoutGrav(linkIdx)));
                if( m_options.includeAllNetExternalWrenchesAsDynamicVariables )
                {
                    setSubVector(d,getRangeLinkVariable(NET_EXT_WRENCH,linkIdx),toEigen(netExtWrenches(linkIdx)));
                }
            }
        }

        for(JointIndex jntIdx = 0; jntIdx < static_cast<JointIndex>(m_model.getNrOfJoints()); jntIdx++)
        {
            IJointConstPtr jnt = m_model.getJoint(jntIdx);

            LinkIndex childLink = m_dynamicsTraversal.getChildLinkIndexFromJointIndex(m_model,jntIdx);
            setSubVector(d,getRangeJointVariable(JOINT_WRENCH,jntIdx),toEigen(linkJointWrenches(childLink)));

            // For ORIGINAL_BERDY_FIXED_BASE, we know that every joint has 1 dof
            setSubVector(d,getRangeDOFVariable(DOF_ACCELERATION,jntIdx),jointAccs(jnt->getDOFsOffset()));
            setSubVector(d,getRangeDOFVariable(DOF_TORQUE,jntIdx),jointTorques(jnt->getDOFsOffset()));
        }
    }

    return true;
}